

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

TSNode * ts_node__prev_sibling(TSNode *__return_storage_ptr__,TSNode self,_Bool include_anonymous)

{
  uint uVar1;
  uint uVar2;
  Subtree other;
  ulong uVar3;
  TSNode self_00;
  bool bVar4;
  ulong *puVar5;
  bool bVar6;
  _Bool _Var7;
  Subtree tree;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  ulong *puVar11;
  bool bVar12;
  TSTree *pTVar13;
  bool bVar14;
  TSNode child;
  NodeChildIterator iterator;
  Length result;
  TSTree *local_138;
  ulong *local_130;
  ulong *local_128;
  TSTree *local_120;
  uint local_118;
  ulong *local_108;
  uint32_t local_e8 [2];
  undefined8 uStackY_e0;
  uint32_t local_d8 [2];
  uint32_t uStackY_d0;
  uint uStackY_cc;
  ulong *local_c8;
  TSTree *in_stack_ffffffffffffff40;
  Subtree in_stack_ffffffffffffff48;
  TSTree *in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff58;
  uint uVar15;
  uint32_t in_stack_ffffffffffffff5c;
  uint32_t local_88 [2];
  undefined8 uStack_80;
  
  other = *self.id;
  if (((ulong)other.ptr & 1) == 0) {
    uVar1 = ((Length *)((long)other + 4))->bytes;
  }
  else {
    uVar1 = other._2_4_ & 0xff;
  }
  if (((ulong)other.ptr & 1) == 0) {
    uVar2 = ((Length *)((long)other + 0x10))->bytes;
  }
  else {
    uVar2 = other._3_4_ & 0xff;
  }
  if (((ulong)other.ptr & 1) == 0) {
    uVar10 = ((other.ptr)->size).bytes;
  }
  else {
    uVar10 = other._3_4_ & 0xff;
  }
  self_00.context._8_8_ = in_stack_ffffffffffffff48.ptr;
  self_00.context._0_8_ = in_stack_ffffffffffffff40;
  self_00.id = in_stack_ffffffffffffff50;
  self_00.tree._0_4_ = in_stack_ffffffffffffff58;
  self_00.tree._4_4_ = in_stack_ffffffffffffff5c;
  ts_node_parent(self_00);
  local_88[0] = 0;
  local_88[1] = 0;
  uStack_80 = 0;
  local_128 = (ulong *)__return_storage_ptr__->id;
  local_120 = __return_storage_ptr__->tree;
  local_130 = (ulong *)0x0;
  local_138 = (TSTree *)0x0;
  bVar4 = false;
  do {
    if (local_108 == (ulong *)0x0) {
      __return_storage_ptr__->context[0] = 0;
      __return_storage_ptr__->context[1] = 0;
      __return_storage_ptr__->context[2] = 0;
      __return_storage_ptr__->context[3] = 0;
      __return_storage_ptr__->id = (void *)0x0;
      __return_storage_ptr__->tree = (TSTree *)0x0;
      return __return_storage_ptr__;
    }
    local_e8[0] = 0;
    local_e8[1] = 0;
    uStackY_e0 = 0;
    if (((*local_108 & 1) != 0) || (uVar15 = local_118, *(int *)(*local_108 + 0x24) == 0)) {
      uVar15 = 0;
    }
    _Var7 = ts_node_child_iterator_next
                      ((NodeChildIterator *)&stack0xffffffffffffff48,(TSNode *)local_d8);
    if (_Var7) {
      bVar12 = false;
      pTVar13 = (TSTree *)0x0;
      puVar11 = (ulong *)0x0;
      do {
        puVar5 = local_c8;
        if (local_c8 == (ulong *)self.id) break;
        if ((uVar10 + self.context[0] < uVar15) ||
           ((uVar15 == uVar10 + self.context[0] &&
            ((uVar1 + uVar2 != 0 ||
             (_Var7 = ts_subtree_has_trailing_empty_descendant((SubtreeHeapData *)*local_c8,other),
             _Var7)))))) {
          if (puVar11 != (ulong *)0x0) {
            local_88[0] = local_e8[0];
            local_88[1] = local_e8[1];
            uStack_80 = uStackY_e0;
            local_138 = pTVar13;
            local_130 = puVar11;
            bVar4 = bVar12;
          }
          local_108 = local_c8;
          local_118 = local_d8[0];
          goto LAB_00129f0b;
        }
        uVar3 = *puVar5;
        if (include_anonymous) {
          if ((uVar3 & 1) == 0) {
            uVar9 = (uint)*(ushort *)(uVar3 + 0x2c);
          }
          else {
            uVar9 = (uint)(uVar3 >> 1) & 0x7fffffff;
          }
          bVar6 = true;
          if ((uVar9 & 1) == 0) {
            bVar14 = uStackY_cc != 0;
LAB_00129dc7:
            bVar6 = true;
            if (bVar14 == false) goto LAB_00129dcd;
          }
LAB_00129dee:
          bVar12 = bVar6;
          uStackY_e0 = CONCAT44(uStackY_cc,uStackY_d0);
          local_e8[0] = local_d8[0];
          local_e8[1] = local_d8[1];
          puVar11 = puVar5;
          pTVar13 = in_stack_ffffffffffffff40;
        }
        else {
          if ((uVar3 & 1) == 0) {
            uVar9 = (uint)*(ushort *)(uVar3 + 0x2c);
          }
          else {
            uVar9 = (uint)(uVar3 >> 1) & 0x7fffffff;
          }
          if ((uVar9 & 1) != 0) {
            if ((uVar3 & 1) == 0) {
              uVar9 = *(uint *)(uVar3 + 0x2c) >> 1;
            }
            else {
              uVar9 = (uint)(uVar3 >> 2) & 0x3fffffff;
            }
            bVar6 = true;
            if ((uVar9 & 1) != 0) goto LAB_00129dee;
          }
          if ((uStackY_cc != 0) && ((ushort)uStackY_cc != 0xfffe)) {
            bVar6 = true;
            if ((uStackY_cc & 0xffff) != 0xffff) {
              bVar14 = (bool)(((byte)in_stack_ffffffffffffff40->language->symbol_metadata
                                     [(ushort)uStackY_cc] & 2) >> 1);
              goto LAB_00129dc7;
            }
            goto LAB_00129dee;
          }
LAB_00129dcd:
          iVar8 = 0;
          if (((uVar3 & 1) == 0) && (*(int *)(uVar3 + 0x24) != 0)) {
            if (include_anonymous) {
              iVar8 = *(int *)(uVar3 + 0x38);
            }
            else {
              iVar8 = *(int *)(uVar3 + 0x3c);
            }
          }
          if (iVar8 != 0) {
            bVar6 = false;
            goto LAB_00129dee;
          }
        }
        _Var7 = ts_node_child_iterator_next
                          ((NodeChildIterator *)&stack0xffffffffffffff48,(TSNode *)local_d8);
      } while (_Var7);
    }
    else {
      puVar11 = (ulong *)0x0;
      pTVar13 = (TSTree *)0x0;
      bVar12 = false;
    }
    if (bVar12) {
      *(uint32_t (*) [2])__return_storage_ptr__->context = local_e8;
      *(undefined8 *)(__return_storage_ptr__->context + 2) = uStackY_e0;
      bVar12 = false;
      local_128 = puVar11;
      local_120 = pTVar13;
    }
    else {
      if (puVar11 == (ulong *)0x0) {
        if (bVar4) {
          *(uint32_t (*) [2])__return_storage_ptr__->context = local_88;
          *(undefined8 *)(__return_storage_ptr__->context + 2) = uStack_80;
          bVar12 = false;
          local_120 = local_138;
          local_128 = local_130;
          goto LAB_00129f0d;
        }
        local_118 = local_88[0];
        local_108 = local_130;
      }
      else {
        local_118 = local_e8[0];
        local_108 = puVar11;
      }
LAB_00129f0b:
      bVar12 = true;
    }
LAB_00129f0d:
    if (!bVar12) {
      __return_storage_ptr__->id = local_128;
      __return_storage_ptr__->tree = local_120;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static inline TSNode ts_node__prev_sibling(TSNode self, bool include_anonymous) {
  Subtree self_subtree = ts_node__subtree(self);
  bool self_is_empty = ts_subtree_total_bytes(self_subtree) == 0;
  uint32_t target_end_byte = ts_node_end_byte(self);

  TSNode node = ts_node_parent(self);
  TSNode earlier_node = ts_node__null();
  bool earlier_node_is_relevant = false;

  while (!ts_node_is_null(node)) {
    TSNode earlier_child = ts_node__null();
    bool earlier_child_is_relevant = false;
    bool found_child_containing_target = false;

    TSNode child;
    NodeChildIterator iterator = ts_node_iterate_children(&node);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (child.id == self.id) break;
      if (iterator.position.bytes > target_end_byte) {
        found_child_containing_target = true;
        break;
      }

      if (iterator.position.bytes == target_end_byte &&
          (!self_is_empty ||
           ts_subtree_has_trailing_empty_descendant(ts_node__subtree(child), self_subtree))) {
        found_child_containing_target = true;
        break;
      }

      if (ts_node__is_relevant(child, include_anonymous)) {
        earlier_child = child;
        earlier_child_is_relevant = true;
      } else if (ts_node__relevant_child_count(child, include_anonymous) > 0) {
        earlier_child = child;
        earlier_child_is_relevant = false;
      }
    }

    if (found_child_containing_target) {
      if (!ts_node_is_null(earlier_child)) {
        earlier_node = earlier_child;
        earlier_node_is_relevant = earlier_child_is_relevant;
      }
      node = child;
    } else if (earlier_child_is_relevant) {
      return earlier_child;
    } else if (!ts_node_is_null(earlier_child)) {
      node = earlier_child;
    } else if (earlier_node_is_relevant) {
      return earlier_node;
    } else {
      node = earlier_node;
    }
  }

  return ts_node__null();
}